

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall
boost::runtime::option::
option<boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::help_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter_combine<boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::env_var_t,boost::unit_test::basic_cstring<char_const>const&>,boost::nfp::named_parameter<boost::unit_test::basic_cstring<char_const>const,boost::runtime::(anonymous_namespace)::description_t,boost::unit_test::basic_cstring<char_const>const&>>>>
          (option *this,cstring name,
          named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::help_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>_>
          *m)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ref_type pbVar5;
  ref_type pbVar6;
  _Alloc_hider local_130;
  size_type local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  _Alloc_hider local_110;
  size_type local_108;
  char local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  char local_e0;
  undefined7 uStack_df;
  undefined8 uStack_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  string *local_c8;
  iterator local_c0;
  iterator local_b8;
  ref_type local_b0;
  cstring local_a8;
  function1<void,_boost::unit_test::basic_cstring<const_char>_> local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_5f;
  undefined4 local_57;
  undefined2 local_53;
  char local_51;
  cstring local_50;
  cstring local_40;
  
  local_b8 = name.m_end;
  local_c0 = name.m_begin;
  pbVar5 = (m->
           super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
           ).
           super_named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
           .m_value;
  bVar2 = (m->
          super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
          ).
          super_named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>
          .m_erased;
  local_b0 = (m->
             super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
             ).m_param.m_value;
  bVar3 = (m->
          super_named_parameter_combine<boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::env_var_t,_const_boost::unit_test::basic_cstring<const_char>_&>,_boost::nfp::named_parameter<const_boost::unit_test::basic_cstring<const_char>,_boost::runtime::(anonymous_namespace)::description_t,_const_boost::unit_test::basic_cstring<const_char>_&>_>
          ).m_param.m_erased;
  pbVar6 = (m->m_param).m_value;
  bVar4 = (m->m_param).m_erased;
  (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001c9fb0;
  local_c8 = &(this->super_basic_param).p_name;
  (this->super_basic_param).p_name._M_dataplus._M_p =
       (pointer)&(this->super_basic_param).p_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>();
  local_e8 = 0;
  local_e0 = '\0';
  local_f0._M_p = &local_e0;
  if (bVar2 == true) {
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_110);
  }
  std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,(ulong)pbVar5->m_begin);
  local_d0 = &(this->super_basic_param).p_description.field_2;
  (this->super_basic_param).p_description._M_dataplus._M_p = (pointer)local_d0;
  if (local_f0._M_p == &local_e0) {
    local_d0->_M_allocated_capacity = CONCAT71(uStack_df,local_e0);
    *(undefined8 *)((long)&(this->super_basic_param).p_description.field_2 + 8) = uStack_d8;
  }
  else {
    (this->super_basic_param).p_description._M_dataplus._M_p = local_f0._M_p;
    (this->super_basic_param).p_description.field_2._M_allocated_capacity =
         CONCAT71(uStack_df,local_e0);
  }
  (this->super_basic_param).p_description._M_string_length = local_e8;
  local_e8 = 0;
  local_e0 = '\0';
  local_108 = 0;
  local_100 = '\0';
  local_110._M_p = &local_100;
  if (bVar4 == false) {
    local_f0._M_p = &local_e0;
    std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,(ulong)pbVar6->m_begin);
    paVar1 = &(this->super_basic_param).p_help.field_2;
    (this->super_basic_param).p_help._M_dataplus._M_p = (pointer)paVar1;
    if (local_110._M_p == &local_100) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_ff,local_100);
      *(undefined8 *)((long)&(this->super_basic_param).p_help.field_2 + 8) = uStack_f8;
    }
    else {
      (this->super_basic_param).p_help._M_dataplus._M_p = local_110._M_p;
      (this->super_basic_param).p_help.field_2._M_allocated_capacity = CONCAT71(uStack_ff,local_100)
      ;
    }
    (this->super_basic_param).p_help._M_string_length = local_108;
    local_108 = 0;
    local_100 = '\0';
    local_128 = 0;
    local_120 = '\0';
    local_130._M_p = &local_120;
    if (bVar3 == false) {
      local_110._M_p = &local_100;
      std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)0x0,(ulong)local_b0->m_begin);
      paVar1 = &(this->super_basic_param).p_env_var.field_2;
      (this->super_basic_param).p_env_var._M_dataplus._M_p = (pointer)paVar1;
      if (local_130._M_p == &local_120) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_11f,local_120);
        *(undefined8 *)((long)&(this->super_basic_param).p_env_var.field_2 + 8) = uStack_118;
      }
      else {
        (this->super_basic_param).p_env_var._M_dataplus._M_p = local_130._M_p;
        (this->super_basic_param).p_env_var.field_2._M_allocated_capacity =
             CONCAT71(uStack_11f,local_120);
      }
      (this->super_basic_param).p_env_var._M_string_length = local_128;
      local_128 = 0;
      local_120 = '\0';
      local_70 = &local_60;
      (this->super_basic_param).p_value_hint._M_dataplus._M_p =
           (pointer)&(this->super_basic_param).p_value_hint.field_2;
      (this->super_basic_param).p_value_hint.field_2._M_local_buf[0] = '\0';
      *(undefined8 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 1) = local_5f;
      *(undefined4 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 9) = local_57;
      *(undefined2 *)((long)&(this->super_basic_param).p_value_hint.field_2 + 0xd) = local_53;
      (this->super_basic_param).p_value_hint.field_2._M_local_buf[0xf] = local_51;
      (this->super_basic_param).p_value_hint._M_string_length = 0;
      local_68 = 0;
      local_60 = 0;
      (this->super_basic_param).p_optional = true;
      (this->super_basic_param).p_repeatable = false;
      (this->super_basic_param).p_has_optional_value = (class_property<bool>)0x1;
      (this->super_basic_param).p_has_default_value = (class_property<bool>)0x1;
      local_90.super_function_base.vtable = (vtable_base *)0x0;
      (this->super_basic_param).p_callback.
      super_function1<void,_boost::unit_test::basic_cstring<const_char>_>.super_function_base.vtable
           = (vtable_base *)0x0;
      local_130._M_p = &local_120;
      function1<void,_boost::unit_test::basic_cstring<const_char>_>::move_assign
                (&(this->super_basic_param).p_callback.
                  super_function1<void,_boost::unit_test::basic_cstring<const_char>_>,&local_90);
      function1<void,_boost::unit_test::basic_cstring<const_char>_>::~function1(&local_90);
      (this->super_basic_param).m_cla_ids.
      super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->super_basic_param).m_cla_ids.
      super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->super_basic_param).m_cla_ids.
      super__Vector_base<boost::runtime::parameter_cla_id,_std::allocator<boost::runtime::parameter_cla_id>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8.m_begin = help_prefix;
      local_a8.m_end = DAT_001cdc28;
      local_40.m_begin = local_c0;
      local_40.m_end = local_b8;
      local_50.m_begin = ":";
      local_50.m_end = "";
      basic_param::add_cla_id_impl
                (&this->super_basic_param,&local_a8,&local_40,&local_50,false,true);
      (this->super_basic_param)._vptr_basic_param = (_func_int **)&PTR__basic_param_001c9f30;
      (this->m_arg_factory).m_optional_value = true;
      (this->m_arg_factory).m_default_value = false;
      return;
    }
    local_110._M_p = &local_100;
    nfp::nil::inst();
    unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
              ((access_to_invalid_parameter *)&local_70);
  }
  local_f0._M_p = &local_e0;
  nfp::nil::inst();
  unit_test::ut_detail::throw_exception<boost::nfp::nfp_detail::access_to_invalid_parameter>
            ((access_to_invalid_parameter *)&local_130);
}

Assistant:

option( cstring name, Modifiers const& m )
#endif
    : basic_param( name, true, false, nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    , m_arg_factory( nfp::opt_append( nfp::opt_append( m, optional_value = true), default_value = false) )
    {
    }